

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<signed_char,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,Array<signed_char,_(unsigned_short)65535> *param_2,uoffset_t param_3,
          Type *param_4,int param_5)

{
  return_type val;
  unsigned_short i;
  uoffset_t i_00;
  int iVar1;
  
  iVar1 = this->opts->indent_step;
  i_00 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  std::__cxx11::string::push_back((char)this->text);
  AddNewLine(this);
  for (; param_3 != i_00; i_00 = i_00 + 1) {
    if (i_00 != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,iVar1 + param_5);
    val = Array<signed_char,_(unsigned_short)65535>::Get(param_2,i_00);
    PrintScalar<signed_char>(this,val,param_4,iVar1 + param_5);
  }
  AddNewLine(this);
  AddIndent(this,param_5);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintScalarTag, const Container &c, SizeT size,
                             const Type &type, int indent, const uint8_t *) {
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      PrintScalar(c[i], type, elem_indent);
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }